

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::MinMaxTest_MaxValue_Test::~MinMaxTest_MaxValue_Test
          (MinMaxTest_MaxValue_Test *this)

{
  MinMaxTest_MaxValue_Test *in_stack_00000010;
  
  anon_unknown.dwarf_13161f6::MinMaxTest_MaxValue_Test::~MinMaxTest_MaxValue_Test(in_stack_00000010)
  ;
  return;
}

Assistant:

TEST_P(MinMaxTest, MaxValue) {
  for (int i = 0; i < 64; i++) {
    uint8_t a[64], b[64];
    memset(a, 0, sizeof(a));
    memset(b, 0, sizeof(b));
    b[i] = i;  // Set a maximum difference of i.

    int min, max;
    API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
    EXPECT_EQ(i, max);
    EXPECT_EQ(0, min);
  }
}